

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O3

void __thiscall
cmTestGenerator::GenerateScriptActions(cmTestGenerator *this,ostream *os,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  pointer pcVar3;
  size_type sVar4;
  ostream *poVar5;
  _Rb_tree_header *p_Var6;
  char *__s;
  _Base_ptr p_Var7;
  int iVar8;
  size_type sVar9;
  pointer pbVar10;
  string sStack_b0;
  int iStack_90;
  allocator<char> aStack_89;
  cmTestGenerator *pcStack_88;
  string sStack_80;
  pointer pbStack_60;
  pointer pbStack_58;
  string sStack_50;
  
  if ((this->super_cmScriptGenerator).ActionsPerConfig != true) {
    this->TestGenerated = true;
    pcVar2 = this->Test;
    pbVar10 = (pcVar2->Command).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    sStack_80._M_dataplus._M_p = (pointer)&sStack_80.field_2;
    pcVar3 = (pbVar10->_M_dataplus)._M_p;
    iStack_90 = indent.Level;
    pcStack_88 = this;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_80,pcVar3,pcVar3 + pbVar10->_M_string_length);
    cmsys::SystemTools::ConvertToUnixSlashes(&sStack_80);
    iVar8 = iStack_90;
    if (0 < iStack_90) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
    sStack_b0._M_dataplus._M_p = (pointer)&sStack_b0.field_2;
    pcVar3 = (pcStack_88->Test->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_b0,pcVar3,pcVar3 + (pcStack_88->Test->Name)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,sStack_b0._M_dataplus._M_p,sStack_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," \"",2);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,sStack_80._M_dataplus._M_p,sStack_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
      operator_delete(sStack_b0._M_dataplus._M_p,sStack_b0.field_2._M_allocated_capacity + 1);
    }
    pbStack_60 = (pcVar2->Command).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    pbVar10 = (pcVar2->Command).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (pbVar10 + 1 != pbStack_60) {
      pbStack_58 = pbVar10 + 1;
      std::__ostream_insert<char,std::char_traits<char>>(os," \"",2);
      sVar4 = pbVar10[1]._M_string_length;
      if (sVar4 != 0) {
        pcVar3 = pbVar10[1]._M_dataplus._M_p;
        sVar9 = 0;
        do {
          cVar1 = pcVar3[sVar9];
          if (cVar1 == '\"') {
            sStack_b0._M_dataplus._M_p._0_1_ = 0x5c;
            std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&sStack_b0,1);
          }
          sStack_b0._M_dataplus._M_p._0_1_ = cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&sStack_b0,1);
          sVar9 = sVar9 + 1;
        } while (sVar4 != sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
      pbVar10 = pbStack_58;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
    cVar1 = (char)os;
    std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pcVar2 = pcStack_88->Test;
    iVar8 = iStack_90;
    if (0 < iStack_90) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties(",0x15);
    sStack_b0._M_dataplus._M_p = (pointer)&sStack_b0.field_2;
    pcVar3 = (pcStack_88->Test->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_b0,pcVar3,pcVar3 + (pcStack_88->Test->Name)._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,sStack_b0._M_dataplus._M_p,sStack_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," PROPERTIES ",0xc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
      operator_delete(sStack_b0._M_dataplus._M_p,sStack_b0.field_2._M_allocated_capacity + 1);
    }
    p_Var7 = (pcVar2->Properties).
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(pcVar2->Properties).
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var7 != p_Var6) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        __s = cmProperty::GetValue((cmProperty *)(p_Var7 + 2));
        std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_50,__s,&aStack_89);
        cmOutputConverter::EscapeForCMake(&sStack_b0,&sStack_50);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,sStack_b0._M_dataplus._M_p,sStack_b0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_b0._M_dataplus._M_p != &sStack_b0.field_2) {
          operator_delete(sStack_b0._M_dataplus._M_p,sStack_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_50._M_dataplus._M_p != &sStack_50.field_2) {
          operator_delete(sStack_50._M_dataplus._M_p,sStack_50.field_2._M_allocated_capacity + 1);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != p_Var6);
    }
    GenerateInternalProperties(pcStack_88,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
    std::ios::widen((char)os->_vptr_basic_ostream[-3] + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_80._M_dataplus._M_p != &sStack_80.field_2) {
      operator_delete(sStack_80._M_dataplus._M_p,sStack_80.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  cmScriptGenerator::GenerateScriptActions(&this->super_cmScriptGenerator,os,indent);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptActions(std::ostream& os, Indent indent)
{
  if (this->ActionsPerConfig) {
    // This is the per-config generation in a single-configuration
    // build generator case.  The superclass will call our per-config
    // method.
    this->cmScriptGenerator::GenerateScriptActions(os, indent);
  } else {
    // This is an old-style test, so there is only one config.
    // assert(this->Test->GetOldStyle());
    this->GenerateOldStyle(os, indent);
  }
}